

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_handler.c
# Opt level: O0

void ngx_stream_init_connection(ngx_connection_t *c)

{
  long *plVar1;
  sockaddr *psVar2;
  void *pvVar3;
  ngx_event_t *ev;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [13];
  undefined1 auVar9 [14];
  ngx_time_t *pnVar10;
  ngx_int_t nVar11;
  char *pcVar12;
  ngx_stream_session_t *s_00;
  size_t sVar13;
  void **ppvVar14;
  ngx_stream_variable_value_t *pnVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  ngx_stream_core_main_conf_t *cmcf;
  ngx_stream_core_srv_conf_t *cscf;
  ngx_stream_in6_addr_t *addr6;
  sockaddr_in6 *sin6;
  ngx_stream_addr_conf_t *addr_conf;
  ngx_stream_session_t *s;
  ngx_stream_in_addr_t *addr;
  sockaddr_in *sin;
  ngx_stream_port_t *port;
  sockaddr *sa;
  ngx_event_t *rev;
  ngx_time_t *tp;
  ngx_uint_t i;
  size_t len;
  u_char text [113];
  ngx_connection_t *c_local;
  
  plVar1 = (long *)c->listening->servers;
  unique0x1000177e = c;
  if ((ulong)plVar1[1] < 2) {
    if (c->local_sockaddr->sa_family == 10) {
      sin6 = (sockaddr_in6 *)(*plVar1 + 0x10);
    }
    else {
      sin6 = (sockaddr_in6 *)(*plVar1 + 8);
    }
  }
  else {
    nVar11 = ngx_connection_local_sockaddr(c,(ngx_str_t *)0x0,0);
    if (nVar11 != 0) {
      ngx_stream_close_connection(stack0xfffffffffffffff0);
      return;
    }
    psVar2 = stack0xfffffffffffffff0->local_sockaddr;
    if (psVar2->sa_family == 10) {
      for (tp = (ngx_time_t *)0x0; tp < (ngx_time_t *)(plVar1[1] - 1U);
          tp = (ngx_time_t *)((long)&tp->sec + 1)) {
        pcVar12 = (char *)(*plVar1 + (long)tp * 0x30);
        cVar16 = -(*pcVar12 == psVar2->sa_data[6]);
        cVar17 = -(pcVar12[1] == psVar2->sa_data[7]);
        cVar18 = -(pcVar12[2] == psVar2->sa_data[8]);
        cVar19 = -(pcVar12[3] == psVar2->sa_data[9]);
        cVar20 = -(pcVar12[4] == psVar2->sa_data[10]);
        cVar21 = -(pcVar12[5] == psVar2->sa_data[0xb]);
        cVar22 = -(pcVar12[6] == psVar2->sa_data[0xc]);
        cVar23 = -(pcVar12[7] == psVar2->sa_data[0xd]);
        cVar24 = -(pcVar12[8] == (char)psVar2[1].sa_family);
        cVar25 = -(pcVar12[9] == *(char *)((long)&psVar2[1].sa_family + 1));
        cVar26 = -(pcVar12[10] == psVar2[1].sa_data[0]);
        cVar27 = -(pcVar12[0xb] == psVar2[1].sa_data[1]);
        cVar28 = -(pcVar12[0xc] == psVar2[1].sa_data[2]);
        cVar29 = -(pcVar12[0xd] == psVar2[1].sa_data[3]);
        cVar30 = -(pcVar12[0xe] == psVar2[1].sa_data[4]);
        bVar31 = -(pcVar12[0xf] == psVar2[1].sa_data[5]);
        auVar4[1] = cVar17;
        auVar4[0] = cVar16;
        auVar4[2] = cVar18;
        auVar4[3] = cVar19;
        auVar4[4] = cVar20;
        auVar4[5] = cVar21;
        auVar4[6] = cVar22;
        auVar4[7] = cVar23;
        auVar4[8] = cVar24;
        auVar4[9] = cVar25;
        auVar4[10] = cVar26;
        auVar4[0xb] = cVar27;
        auVar4[0xc] = cVar28;
        auVar4[0xd] = cVar29;
        auVar4[0xe] = cVar30;
        auVar4[0xf] = bVar31;
        auVar5[1] = cVar17;
        auVar5[0] = cVar16;
        auVar5[2] = cVar18;
        auVar5[3] = cVar19;
        auVar5[4] = cVar20;
        auVar5[5] = cVar21;
        auVar5[6] = cVar22;
        auVar5[7] = cVar23;
        auVar5[8] = cVar24;
        auVar5[9] = cVar25;
        auVar5[10] = cVar26;
        auVar5[0xb] = cVar27;
        auVar5[0xc] = cVar28;
        auVar5[0xd] = cVar29;
        auVar5[0xe] = cVar30;
        auVar5[0xf] = bVar31;
        auVar9[1] = cVar19;
        auVar9[0] = cVar18;
        auVar9[2] = cVar20;
        auVar9[3] = cVar21;
        auVar9[4] = cVar22;
        auVar9[5] = cVar23;
        auVar9[6] = cVar24;
        auVar9[7] = cVar25;
        auVar9[8] = cVar26;
        auVar9[9] = cVar27;
        auVar9[10] = cVar28;
        auVar9[0xb] = cVar29;
        auVar9[0xc] = cVar30;
        auVar9[0xd] = bVar31;
        auVar8[1] = cVar20;
        auVar8[0] = cVar19;
        auVar8[2] = cVar21;
        auVar8[3] = cVar22;
        auVar8[4] = cVar23;
        auVar8[5] = cVar24;
        auVar8[6] = cVar25;
        auVar8[7] = cVar26;
        auVar8[8] = cVar27;
        auVar8[9] = cVar28;
        auVar8[10] = cVar29;
        auVar8[0xb] = cVar30;
        auVar8[0xc] = bVar31;
        auVar7[1] = cVar21;
        auVar7[0] = cVar20;
        auVar7[2] = cVar22;
        auVar7[3] = cVar23;
        auVar7[4] = cVar24;
        auVar7[5] = cVar25;
        auVar7[6] = cVar26;
        auVar7[7] = cVar27;
        auVar7[8] = cVar28;
        auVar7[9] = cVar29;
        auVar7[10] = cVar30;
        auVar7[0xb] = bVar31;
        auVar6[1] = cVar22;
        auVar6[0] = cVar21;
        auVar6[2] = cVar23;
        auVar6[3] = cVar24;
        auVar6[4] = cVar25;
        auVar6[5] = cVar26;
        auVar6[6] = cVar27;
        auVar6[7] = cVar28;
        auVar6[8] = cVar29;
        auVar6[9] = cVar30;
        auVar6[10] = bVar31;
        if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar9 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar8 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar31,CONCAT18(cVar30,CONCAT17(cVar29,CONCAT16(cVar28
                                                  ,CONCAT15(cVar27,CONCAT14(cVar26,CONCAT13(cVar25,
                                                  CONCAT12(cVar24,CONCAT11(cVar23,cVar22))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar31,CONCAT17(cVar30,CONCAT16(cVar29,CONCAT15(cVar28
                                                  ,CONCAT14(cVar27,CONCAT13(cVar26,CONCAT12(cVar25,
                                                  CONCAT11(cVar24,cVar23)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar31 >> 7) << 0xf) == 0xffff) break;
      }
      sin6 = (sockaddr_in6 *)(*plVar1 + (long)tp * 0x30 + 0x10);
    }
    else {
      for (tp = (ngx_time_t *)0x0;
          (tp < (ngx_time_t *)(plVar1[1] - 1U) &&
          (*(int *)(*plVar1 + (long)tp * 0x28) != *(int *)(psVar2->sa_data + 2)));
          tp = (ngx_time_t *)((long)&tp->sec + 1)) {
      }
      sin6 = (sockaddr_in6 *)(*plVar1 + (long)tp * 0x28 + 8);
    }
  }
  s_00 = (ngx_stream_session_t *)ngx_pcalloc(stack0xfffffffffffffff0->pool,0x90);
  if (s_00 == (ngx_stream_session_t *)0x0) {
    ngx_stream_close_connection(stack0xfffffffffffffff0);
  }
  else {
    s_00->signature = 0x4d525453;
    s_00->main_conf = (void **)**(undefined8 **)sin6;
    s_00->srv_conf = *(void ***)(*(long *)sin6 + 8);
    if (stack0xfffffffffffffff0->buffer != (ngx_buf_t *)0x0) {
      s_00->received =
           (off_t)(stack0xfffffffffffffff0->buffer->last +
                  (s_00->received - (long)stack0xfffffffffffffff0->buffer->pos));
    }
    s_00->connection = stack0xfffffffffffffff0;
    stack0xfffffffffffffff0->data = s_00;
    pvVar3 = s_00->srv_conf[ngx_stream_core_module.ctx_index];
    stack0xfffffffffffffff0->log->file = *(ngx_open_file_t **)(*(long *)((long)pvVar3 + 0x38) + 8);
    stack0xfffffffffffffff0->log->next = *(ngx_log_t **)(*(long *)((long)pvVar3 + 0x38) + 0x48);
    stack0xfffffffffffffff0->log->writer =
         *(ngx_log_writer_pt *)(*(long *)((long)pvVar3 + 0x38) + 0x30);
    stack0xfffffffffffffff0->log->wdata = *(void **)(*(long *)((long)pvVar3 + 0x38) + 0x38);
    if ((stack0xfffffffffffffff0->log->log_level & 0x80000000) == 0) {
      stack0xfffffffffffffff0->log->log_level = **(ngx_uint_t **)((long)pvVar3 + 0x38);
    }
    sVar13 = ngx_sock_ntop(stack0xfffffffffffffff0->sockaddr,stack0xfffffffffffffff0->socklen,
                           (u_char *)&len,0x71,1);
    if (6 < stack0xfffffffffffffff0->log->log_level) {
      pcVar12 = "";
      if (stack0xfffffffffffffff0->type == 2) {
        pcVar12 = "udp ";
      }
      ngx_log_error_core(7,stack0xfffffffffffffff0->log,0,"*%uA %sclient %*s connected to %V",
                         stack0xfffffffffffffff0->number,pcVar12,sVar13,&len,&sin6->sin6_addr);
    }
    stack0xfffffffffffffff0->log->connection = stack0xfffffffffffffff0->number;
    stack0xfffffffffffffff0->log->handler = ngx_stream_log_error;
    stack0xfffffffffffffff0->log->data = s_00;
    stack0xfffffffffffffff0->log->action = "initializing session";
    *(uint *)&stack0xfffffffffffffff0->field_0xd8 =
         *(uint *)&stack0xfffffffffffffff0->field_0xd8 & 0xfffff8ff | 0x200;
    ppvVar14 = (void **)ngx_pcalloc(stack0xfffffffffffffff0->pool,ngx_stream_max_module << 3);
    s_00->ctx = ppvVar14;
    if (s_00->ctx == (void **)0x0) {
      ngx_stream_close_connection(stack0xfffffffffffffff0);
    }
    else {
      pnVar15 = (ngx_stream_variable_value_t *)
                ngx_pcalloc(s_00->connection->pool,
                            *(long *)((long)s_00->main_conf[ngx_stream_core_module.ctx_index] + 0x70
                                     ) << 4);
      s_00->variables = pnVar15;
      pnVar10 = ngx_cached_time;
      if (s_00->variables == (ngx_stream_variable_value_t *)0x0) {
        ngx_stream_close_connection(stack0xfffffffffffffff0);
      }
      else {
        s_00->start_sec = ngx_cached_time->sec;
        s_00->start_msec = pnVar10->msec;
        ev = stack0xfffffffffffffff0->read;
        ev->handler = ngx_stream_session_handler;
        if (((byte)sin6->sin6_scope_id >> 1 & 1) != 0) {
          stack0xfffffffffffffff0->log->action = "reading PROXY protocol";
          ev->handler = ngx_stream_proxy_protocol_handler;
          if ((*(uint *)&ev->field_0x8 >> 5 & 1) == 0) {
            ngx_event_add_timer(ev,*(ngx_msec_t *)((long)pvVar3 + 0x50));
            nVar11 = ngx_handle_read_event(ev,0);
            if (nVar11 == 0) {
              return;
            }
            ngx_stream_finalize_session(s_00,500);
            return;
          }
        }
        if (ngx_use_accept_mutex == 0) {
          (*ev->handler)(ev);
        }
        else if ((*(uint *)&ev->field_0x8 >> 0xf & 1) == 0) {
          *(uint *)&ev->field_0x8 = *(uint *)&ev->field_0x8 & 0xffff7fff | 0x8000;
          (ev->queue).prev = ngx_posted_events.prev;
          ((ev->queue).prev)->next = &ev->queue;
          (ev->queue).next = &ngx_posted_events;
          ngx_posted_events.prev = &ev->queue;
          if ((ev->log->log_level & 0x10) != 0) {
            ngx_log_error_core(8,ev->log,0,"post event %p",ev);
          }
        }
        else if ((ev->log->log_level & 0x10) != 0) {
          ngx_log_error_core(8,ev->log,0,"update posted event %p",ev);
        }
      }
    }
  }
  return;
}

Assistant:

void
ngx_stream_init_connection(ngx_connection_t *c)
{
    u_char                        text[NGX_SOCKADDR_STRLEN];
    size_t                        len;
    ngx_uint_t                    i;
    ngx_time_t                   *tp;
    ngx_event_t                  *rev;
    struct sockaddr              *sa;
    ngx_stream_port_t            *port;
    struct sockaddr_in           *sin;
    ngx_stream_in_addr_t         *addr;
    ngx_stream_session_t         *s;
    ngx_stream_addr_conf_t       *addr_conf;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6          *sin6;
    ngx_stream_in6_addr_t        *addr6;
#endif
    ngx_stream_core_srv_conf_t   *cscf;
    ngx_stream_core_main_conf_t  *cmcf;

    /* find the server configuration for the address:port */

    port = c->listening->servers;

    if (port->naddrs > 1) {

        /*
         * There are several addresses on this port and one of them
         * is the "*:port" wildcard so getsockname() is needed to determine
         * the server address.
         *
         * AcceptEx() and recvmsg() already gave this address.
         */

        if (ngx_connection_local_sockaddr(c, NULL, 0) != NGX_OK) {
            ngx_stream_close_connection(c);
            return;
        }

        sa = c->local_sockaddr;

        switch (sa->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            sin6 = (struct sockaddr_in6 *) sa;

            addr6 = port->addrs;

            /* the last address is "*" */

            for (i = 0; i < port->naddrs - 1; i++) {
                if (ngx_memcmp(&addr6[i].addr6, &sin6->sin6_addr, 16) == 0) {
                    break;
                }
            }

            addr_conf = &addr6[i].conf;

            break;
#endif

        default: /* AF_INET */
            sin = (struct sockaddr_in *) sa;

            addr = port->addrs;

            /* the last address is "*" */

            for (i = 0; i < port->naddrs - 1; i++) {
                if (addr[i].addr == sin->sin_addr.s_addr) {
                    break;
                }
            }

            addr_conf = &addr[i].conf;

            break;
        }

    } else {
        switch (c->local_sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            addr6 = port->addrs;
            addr_conf = &addr6[0].conf;
            break;
#endif

        default: /* AF_INET */
            addr = port->addrs;
            addr_conf = &addr[0].conf;
            break;
        }
    }

    s = ngx_pcalloc(c->pool, sizeof(ngx_stream_session_t));
    if (s == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    s->signature = NGX_STREAM_MODULE;
    s->main_conf = addr_conf->ctx->main_conf;
    s->srv_conf = addr_conf->ctx->srv_conf;

#if (NGX_STREAM_SSL)
    s->ssl = addr_conf->ssl;
#endif

    if (c->buffer) {
        s->received += c->buffer->last - c->buffer->pos;
    }

    s->connection = c;
    c->data = s;

    cscf = ngx_stream_get_module_srv_conf(s, ngx_stream_core_module);

    ngx_set_connection_log(c, cscf->error_log);

    len = ngx_sock_ntop(c->sockaddr, c->socklen, text, NGX_SOCKADDR_STRLEN, 1);

    ngx_log_error(NGX_LOG_INFO, c->log, 0, "*%uA %sclient %*s connected to %V",
                  c->number, c->type == SOCK_DGRAM ? "udp " : "",
                  len, text, &addr_conf->addr_text);

    c->log->connection = c->number;
    c->log->handler = ngx_stream_log_error;
    c->log->data = s;
    c->log->action = "initializing session";
    c->log_error = NGX_ERROR_INFO;

    s->ctx = ngx_pcalloc(c->pool, sizeof(void *) * ngx_stream_max_module);
    if (s->ctx == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    cmcf = ngx_stream_get_module_main_conf(s, ngx_stream_core_module);

    s->variables = ngx_pcalloc(s->connection->pool,
                               cmcf->variables.nelts
                               * sizeof(ngx_stream_variable_value_t));

    if (s->variables == NULL) {
        ngx_stream_close_connection(c);
        return;
    }

    tp = ngx_timeofday();
    s->start_sec = tp->sec;
    s->start_msec = tp->msec;

    rev = c->read;
    rev->handler = ngx_stream_session_handler;

    if (addr_conf->proxy_protocol) {
        c->log->action = "reading PROXY protocol";

        rev->handler = ngx_stream_proxy_protocol_handler;

        if (!rev->ready) {
            ngx_add_timer(rev, cscf->proxy_protocol_timeout);

            if (ngx_handle_read_event(rev, 0) != NGX_OK) {
                ngx_stream_finalize_session(s,
                                            NGX_STREAM_INTERNAL_SERVER_ERROR);
            }

            return;
        }
    }

    if (ngx_use_accept_mutex) {
        ngx_post_event(rev, &ngx_posted_events);
        return;
    }

    rev->handler(rev);
}